

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O1

int md_is_table_underline(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET *p_end,uint *p_col_count)

{
  uint uVar1;
  MD_CHAR *pMVar2;
  _func_void_char_ptr_void_ptr *p_Var3;
  bool bVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  
  uVar5 = (ulong)beg;
  uVar1 = ctx->size;
  uVar8 = 0;
  if ((beg < uVar1) && (ctx->text[uVar5] == '|')) {
    uVar11 = (ulong)(beg + 1);
    bVar4 = true;
    uVar10 = 0;
    if (beg + 1 < uVar1) {
      pbVar6 = (byte *)(ctx->text + uVar5);
      do {
        pbVar6 = pbVar6 + 1;
        uVar10 = uVar8;
        if ((0x20 < (ulong)*pbVar6) || ((0x100001a00U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0))
        goto LAB_005d60c0;
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar1 != uVar10);
      uVar11 = (ulong)uVar1;
      uVar10 = uVar8;
    }
  }
  else {
    bVar4 = false;
    uVar11 = uVar5;
    uVar10 = uVar8;
  }
LAB_005d60c0:
  uVar1 = ctx->size;
  uVar5 = (ulong)uVar1;
  if ((uint)uVar11 < uVar1) {
    uVar11 = (ulong)((uint)(ctx->text[uVar11 & 0xffffffff] == ':') + (uint)uVar11);
  }
  iVar13 = 1;
  if ((uint)uVar11 < uVar1) {
    pMVar2 = ctx->text;
    uVar7 = uVar11 & 0xffffffff;
    if (pMVar2[uVar7] != '-') goto LAB_005d61dd;
    bVar14 = (uint)uVar11 < uVar1;
    if (bVar14) {
      if (pMVar2[uVar7] == '-') {
        do {
          if (uVar1 - 1 == (int)uVar7) {
            uVar11 = (ulong)uVar1;
            goto LAB_005d6146;
          }
          uVar11 = uVar7 + 1;
          lVar9 = uVar7 + 1;
          uVar7 = uVar11;
        } while (pMVar2[lVar9] == '-');
        bVar14 = (uint)uVar11 < uVar1;
      }
      if (bVar14) {
        uVar11 = (ulong)((uint)(pMVar2[uVar11 & 0xffffffff] == ':') + (int)uVar11);
      }
    }
LAB_005d6146:
    uVar10 = uVar10 + 1;
    if (0x80 < uVar10) {
      p_Var3 = (ctx->parser).debug_log;
      if (p_Var3 != (_func_void_char_ptr_void_ptr *)0x0) {
        (*p_Var3)("Suppressing table (column_count >128)",ctx->userdata);
      }
      goto LAB_005d61dd;
    }
    iVar13 = 1;
    bVar14 = (uint)uVar11 < uVar1;
    if (bVar14) {
      uVar7 = uVar11 & 0xffffffff;
      lVar9 = 0;
      do {
        if ((0x20 < (ulong)(byte)pMVar2[lVar9 + uVar7]) ||
           ((0x100001a00U >> ((ulong)(byte)pMVar2[lVar9 + uVar7] & 0x3f) & 1) == 0)) {
          uVar11 = uVar7 + lVar9;
          if ((!bVar14) || (pMVar2[uVar11 & 0xffffffff] != '|')) goto LAB_005d61c1;
          uVar12 = uVar7 + lVar9 + 1;
          if (uVar1 <= (uint)uVar12) goto LAB_005d60b2;
          uVar12 = uVar7 + lVar9 + 1;
          goto LAB_005d6088;
        }
        bVar14 = lVar9 + uVar7 + 1 < uVar5;
        lVar9 = lVar9 + 1;
      } while ((uVar7 - uVar5) + lVar9 != 0);
      uVar11 = (ulong)((uint)uVar11 + (int)lVar9);
    }
    goto LAB_005d61c1;
  }
  goto LAB_005d61dd;
  while( true ) {
    uVar12 = uVar12 + 1;
    iVar13 = 0;
    bVar4 = true;
    uVar11 = uVar5;
    if (uVar5 <= uVar12) break;
LAB_005d6088:
    if ((0x20 < (ulong)(byte)pMVar2[uVar12]) ||
       ((0x100001a00U >> ((ulong)(byte)pMVar2[uVar12] & 0x3f) & 1) == 0)) goto LAB_005d60b2;
  }
LAB_005d61c1:
  if (((uVar1 <= (uint)uVar11) || (pMVar2[uVar11 & 0xffffffff] == '\n')) ||
     (pMVar2[uVar11 & 0xffffffff] == '\r')) {
    iVar13 = 5;
  }
LAB_005d61dd:
  if (iVar13 != 0) {
    if ((iVar13 == 5) && (bVar4)) {
      *p_end = (MD_OFFSET)uVar11;
      *p_col_count = uVar10;
      iVar13 = 1;
    }
    else {
      iVar13 = 0;
    }
    return iVar13;
  }
  goto LAB_005d60c0;
LAB_005d60b2:
  iVar13 = 0;
  bVar4 = true;
  uVar11 = uVar12;
  goto LAB_005d61c1;
}

Assistant:

static int
md_is_table_underline(MD_CTX* ctx, OFF beg, OFF* p_end, unsigned* p_col_count)
{
    OFF off = beg;
    int found_pipe = FALSE;
    unsigned col_count = 0;

    if(off < ctx->size  &&  CH(off) == _T('|')) {
        found_pipe = TRUE;
        off++;
        while(off < ctx->size  &&  ISWHITESPACE(off))
            off++;
    }

    while(1) {
        int delimited = FALSE;

        /* Cell underline ("-----", ":----", "----:" or ":----:") */
        if(off < ctx->size  &&  CH(off) == _T(':'))
            off++;
        if(off >= ctx->size  ||  CH(off) != _T('-'))
            return FALSE;
        while(off < ctx->size  &&  CH(off) == _T('-'))
            off++;
        if(off < ctx->size  &&  CH(off) == _T(':'))
            off++;

        col_count++;
        if(col_count > TABLE_MAXCOLCOUNT) {
            MD_LOG("Suppressing table (column_count >" STRINGIZE(TABLE_MAXCOLCOUNT) ")");
            return FALSE;
        }

        /* Pipe delimiter (optional at the end of line). */
        while(off < ctx->size  &&  ISWHITESPACE(off))
            off++;
        if(off < ctx->size  &&  CH(off) == _T('|')) {
            delimited = TRUE;
            found_pipe =  TRUE;
            off++;
            while(off < ctx->size  &&  ISWHITESPACE(off))
                off++;
        }

        /* Success, if we reach end of line. */
        if(off >= ctx->size  ||  ISNEWLINE(off))
            break;

        if(!delimited)
            return FALSE;
    }

    if(!found_pipe)
        return FALSE;

    *p_end = off;
    *p_col_count = col_count;
    return TRUE;
}